

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

void __thiscall DetailButton::DetailButton(DetailButton *this,QWidget *parent)

{
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)&(this->super_QPushButton).super_QAbstractButton.super_QWidget =
       &PTR_metaObject_00812e08;
  *(undefined ***)&(this->super_QPushButton).super_QAbstractButton.super_QWidget.super_QPaintDevice
       = &PTR__DetailButton_00812fd8;
  QMetaObject::tr((char *)&local_48,(char *)&QMessageBox::staticMetaObject,0x6f6cb4);
  QPushButton::QPushButton(&this->super_QPushButton,&local_48,parent);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  *(undefined ***)&(this->super_QPushButton).super_QAbstractButton.super_QWidget =
       &PTR_metaObject_00812e08;
  *(undefined ***)&(this->super_QPushButton).super_QAbstractButton.super_QWidget.super_QPaintDevice
       = &PTR__DetailButton_00812fd8;
  QWidget::setSizePolicy((QWidget *)this,(QSizePolicy)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DetailButton(QWidget *parent) : QPushButton(label(ShowLabel), parent)
    {
        setSizePolicy(QSizePolicy::Fixed, QSizePolicy::Fixed);
    }